

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::MockCodeGenerator::GetOutputFileContent_abi_cxx11_
          (string *__return_storage_ptr__,MockCodeGenerator *this,string_view generator_name,
          string_view parameter,string_view file,string_view parsed_file_list,
          string_view first_message_name)

{
  string_view format;
  MockCodeGenerator *local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  size_t local_48;
  char *pcStack_40;
  size_t local_38;
  char *pcStack_30;
  size_t local_28;
  char *pcStack_20;
  
  local_50 = parameter._M_len;
  local_58 = generator_name._M_str;
  local_60 = generator_name._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48 = file._M_len;
  pcStack_40 = file._M_str;
  local_38 = first_message_name._M_len;
  pcStack_30 = first_message_name._M_str;
  local_28 = parsed_file_list._M_len;
  pcStack_20 = parsed_file_list._M_str;
  format._M_str = (char *)&local_68;
  format._M_len = (size_t)"$0: $1, $2, $3, $4\n";
  local_68 = this;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)&DAT_00000013,
             format,(Nullable<const_absl::string_view_*>)0x5,(size_t)parameter._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string MockCodeGenerator::GetOutputFileContent(
    absl::string_view generator_name, absl::string_view parameter,
    absl::string_view file, absl::string_view parsed_file_list,
    absl::string_view first_message_name) {
  return absl::Substitute("$0: $1, $2, $3, $4\n", generator_name, parameter,
                          file, first_message_name, parsed_file_list);
}